

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O0

void read_grammar(void)

{
  int iVar1;
  ushort **ppuVar2;
  int c;
  
  initialize_grammar();
  advance_to_start();
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            iVar1 = nextc();
            if (iVar1 == -1) goto LAB_0011b34c;
            ppuVar2 = __ctype_b_loc();
            if (((((((*ppuVar2)[iVar1] & 0x400) == 0) && (iVar1 != 0x5f)) && (iVar1 != 0x2e)) &&
                ((iVar1 != 0x24 && (iVar1 != 0x27)))) && (iVar1 != 0x22)) break;
            add_symbol();
          }
          if (((iVar1 != 0x7b) && (iVar1 != 0x3d)) && (iVar1 != 0x5b)) break;
          copy_action();
        }
        if (iVar1 != 0x7c) break;
        end_rule();
        start_rule(plhs[nrules + -1],0);
        cptr = cptr + 1;
      }
      if (iVar1 == 0x25) break;
      syntax_error(input_file->lineno,line,cptr);
    }
    iVar1 = mark_symbol();
  } while (iVar1 == 0);
LAB_0011b34c:
  end_rule();
  if (0 < goal->args) {
    error(0,(char *)0x0,(char *)0x0,"start symbol %s requires arguments",goal->name);
  }
  return;
}

Assistant:

void read_grammar()
{
    register int c;

    initialize_grammar();
    advance_to_start();

    for (;;) {
	c = nextc();
	if (c == EOF) break;
	if (isalpha(c) || c == '_' || c == '.' || c == '$' || c == '\'' ||
		c == '"')
	    add_symbol();
	else if (c == '{' || c == '=' || c == '[')
	    copy_action();
	else if (c == '|') {
	    end_rule();
	    start_rule(plhs[nrules-1], 0);
	    ++cptr; }
	else if (c == '%') {
	    if (mark_symbol()) break; }
	else
	    syntax_error(input_file->lineno, line, cptr); }
    end_rule();
    if (goal->args > 0)
	error(0, 0, 0, "start symbol %s requires arguments", goal->name);
}